

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void askPassword(arguments *args)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ushort local_81c;
  uint8_t local_818 [4];
  uint16_t pw2_len;
  uint16_t pw1_len;
  uint8_t pw2 [1024];
  uint8_t pw1 [1024];
  _Bool match;
  _Bool first;
  arguments *args_local;
  
  bVar2 = true;
  bVar1 = false;
  memset(pw2 + 0x3f8,0,0x400);
  memset(local_818,0,0x400);
  local_81c = 0;
  while (!bVar1) {
    if (!bVar2) {
      printf("Passwords do not match\n");
    }
    bVar2 = false;
    sVar4 = getPassword("Enter password:",pw2 + 0x3f8,0x400,_stdin);
    uVar5 = getPassword("Confirm password:",local_818,0x400,_stdin);
    local_81c = (ushort)uVar5;
    if (((ushort)sVar4 < 6) || (local_81c < 6)) {
      printf("Password must be at least 6 characters in length\n");
    }
    else if (((ushort)sVar4 == local_81c) &&
            (iVar3 = memcmp(pw2 + 0x3f8,local_818,uVar5 & 0xffff), iVar3 == 0)) {
      bVar1 = true;
    }
    else {
      zeroFill(pw2 + 0x3f8,0x400);
      zeroFill(local_818,0x400);
    }
  }
  printf("Password accepted\n");
  puVar6 = (uint8_t *)calloc((long)(int)(local_81c + 1),1);
  args->password = puVar6;
  memcpy(args->password,local_818,(ulong)local_81c);
  args->field_0x3c = args->field_0x3c & 0xfd | 2;
  args->pw_length = (ulong)local_81c;
  zeroFill(pw2 + 0x3f8,0x400);
  zeroFill(local_818,0x400);
  return;
}

Assistant:

void askPassword(arguments* args)
{
    bool first = true;
    bool match = false;
    const static uint8_t pw_prompt[] = 
    { 
        'E', 'n', 't', 'e', 'r', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd', ':', '\0'
    };
    const static uint8_t conf_prompt[] = 
    {
        'C', 'o', 'n', 'f', 'i', 'r', 'm', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd',
        ':', '\0'
    };

    uint8_t pw1[BUFF_SIZE] = { 0 };
    uint8_t pw2[BUFF_SIZE] = { 0 };
    uint16_t pw1_len = 0;
    uint16_t pw2_len = 0;
 
    while (match == false) //TODO find a portable way to do this
    {
        if (!first) { printf("Passwords do not match\n"); }

        first = false;

        pw1_len = getPassword((uint8_t*)pw_prompt, pw1, BUFF_SIZE, stdin);
        pw2_len = getPassword((uint8_t*)conf_prompt, pw2, BUFF_SIZE, stdin);

        if (pw1_len < 6 || pw2_len < 6) { printf("Password must be at least 6 characters in length\n"); } 
        else if ((pw1_len == pw2_len) && memcmp(pw1, pw2, pw2_len) == 0) { match = true; }
        else //clear buffers from failed pw attempts
        {
            zeroFill(pw1, BUFF_SIZE);
            zeroFill(pw2, BUFF_SIZE);
        }
    }

    printf("Password accepted\n");
    args->password = calloc(pw2_len+1, sizeof(uint8_t));
    memcpy(args->password, pw2, pw2_len);
    args->free = true; //set the flag to free it since we allocated memory for this pw
    args->pw_length = pw2_len; //ad the pw length to the arguments structure

    //zero_fill the temp pw_buffers
    zeroFill(pw1, BUFF_SIZE);
    zeroFill(pw2, BUFF_SIZE);
    pd3("password set to: %s\n", args->password);
}